

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getSlacks(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *p_vector)

{
  undefined8 *puVar1;
  uint *puVar2;
  uint uVar3;
  fpclass_type fVar4;
  pointer pnVar5;
  SPxId *pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  int iVar15;
  Status SVar16;
  long lVar17;
  pointer pnVar18;
  undefined8 *puVar19;
  long lVar20;
  undefined8 *local_98;
  long lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined4 uStack_70;
  undefined4 local_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_58;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_50;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  DataKey local_40;
  DataKey local_38;
  
  if (this->initialized == false) {
    puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"XSOLVE11 No Problem loaded","");
    *puVar19 = &PTR__SPxException_006a9ee8;
    puVar19[1] = puVar19 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar19 + 1),local_98,lStack_90 + (long)local_98);
    *puVar19 = &PTR__SPxException_006aa100;
    __cxa_throw(puVar19,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  if (this->theRep == COLUMN) {
    lVar17 = (long)(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar17) {
      lVar20 = lVar17 + 1;
      lVar17 = lVar17 * 0x50;
      do {
        switch((this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.rowstat.data[lVar20 + -2]) {
        case D_FREE:
        case D_ON_UPPER:
        case D_ON_LOWER:
        case D_ON_BOTH:
        case D_UNDEFINED:
          break;
        case P_FIXED:
        case P_ON_UPPER:
          pnVar18 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00393849;
        default:
          puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_98 = &local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"XSOLVE12 This should never happen.","");
          *puVar19 = &PTR__SPxException_006a9ee8;
          puVar19[1] = puVar19 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar19 + 1),local_98,lStack_90 + (long)local_98);
          *puVar19 = &PTR__SPxException_006a9ec0;
          __cxa_throw(puVar19,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        case P_ON_LOWER:
          pnVar18 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_00393849:
          pnVar5 = (p_vector->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar19 = (undefined8 *)((long)&pnVar18[-1].m_backend.data + lVar17);
          uVar7 = *puVar19;
          uVar8 = puVar19[1];
          puVar19 = (undefined8 *)((long)&(pnVar18->m_backend).data + lVar17 + -0x40);
          uVar9 = *puVar19;
          uVar10 = puVar19[1];
          puVar19 = (undefined8 *)((long)&(pnVar18->m_backend).data + lVar17 + -0x30);
          uVar11 = *puVar19;
          uVar12 = puVar19[1];
          puVar19 = (undefined8 *)((long)&(pnVar18->m_backend).data + lVar17 + -0x20);
          uVar13 = puVar19[1];
          puVar1 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar17 + -0x20);
          *puVar1 = *puVar19;
          puVar1[1] = uVar13;
          puVar19 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar17 + -0x30);
          *puVar19 = uVar11;
          puVar19[1] = uVar12;
          puVar19 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar17 + -0x40);
          *puVar19 = uVar9;
          puVar19[1] = uVar10;
          puVar19 = (undefined8 *)((long)&pnVar5[-1].m_backend.data + lVar17);
          *puVar19 = uVar7;
          puVar19[1] = uVar8;
          *(undefined4 *)((long)&(pnVar5->m_backend).data + lVar17 + -0x10) =
               *(undefined4 *)((long)&(pnVar18->m_backend).data + lVar17 + -0x10);
          *(undefined1 *)((long)&(pnVar5->m_backend).data + lVar17 + -0xc) =
               *(undefined1 *)((long)&(pnVar18->m_backend).data + lVar17 + -0xc);
          *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar17 + -8) =
               *(undefined8 *)((long)&(pnVar18->m_backend).data + lVar17 + -8);
          break;
        case P_FREE:
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)
                     ((long)&(p_vector->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17),
                     0);
        }
        lVar20 = lVar20 + -1;
        lVar17 = lVar17 + -0x50;
      } while (1 < lVar20);
    }
    lVar17 = (long)(this->thecovectors->set).thenum;
    local_48 = p_vector;
    if (0 < lVar17) {
      local_50 = &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set;
      lVar20 = lVar17 + 1;
      lVar17 = lVar17 * 10 + -1;
      local_58 = this;
      do {
        pSVar6 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data;
        if ((int)(pSVar6[lVar20 + -2].super_DataKey.info & -0x80000000) != 0) {
          pnVar18 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar3 = *(uint *)((long)&pnVar18->m_backend + lVar17 * 8 + -0x48);
          puVar2 = (uint *)((long)&pnVar18->m_backend + lVar17 * 8 + -0x18);
          uStack_64 = *(undefined8 *)(puVar2 + 2);
          uStack_68 = (undefined4)((ulong)*(undefined8 *)puVar2 >> 0x20);
          puVar2 = (uint *)((long)&pnVar18->m_backend + lVar17 * 8 + -0x24);
          uStack_78 = *(undefined8 *)puVar2;
          uVar7 = *(undefined8 *)(puVar2 + 2);
          uStack_70 = (undefined4)uVar7;
          local_6c = (undefined4)((ulong)uVar7 >> 0x20);
          puVar2 = (uint *)((long)&pnVar18->m_backend + lVar17 * 8 + -0x34);
          local_88 = *(undefined8 *)puVar2;
          uStack_80 = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)&pnVar18->m_backend + lVar17 * 8 + -0x44);
          local_98 = *(undefined8 **)puVar2;
          lStack_90 = *(long *)(puVar2 + 2);
          fVar4 = *(fpclass_type *)((long)&pnVar18->m_backend + lVar17 * 8 + -8);
          uVar7 = *(undefined8 *)((long)&pnVar18->m_backend + lVar17 * 8);
          iVar14 = *(int32_t *)((long)&pnVar18->m_backend + lVar17 * 8 + -4);
          local_40 = pSVar6[lVar20 + -2].super_DataKey;
          SPxRowId::SPxRowId((SPxRowId *)&local_38,(SPxId *)&local_40);
          iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   ::number(local_50,&local_38);
          pnVar18 = (local_48->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar18[iVar15].m_backend.data._M_elems[0] = uVar3;
          puVar2 = (uint *)((long)&pnVar18[iVar15].m_backend.data + 0x30);
          *(ulong *)puVar2 = CONCAT44(uStack_68,local_6c);
          *(undefined8 *)(puVar2 + 2) = uStack_64;
          puVar2 = (uint *)((long)&pnVar18[iVar15].m_backend.data + 0x24);
          *(undefined8 *)puVar2 = uStack_78;
          *(ulong *)(puVar2 + 2) = CONCAT44(local_6c,uStack_70);
          puVar2 = (uint *)((long)&pnVar18[iVar15].m_backend.data + 0x14);
          *(undefined8 *)puVar2 = local_88;
          *(undefined8 *)(puVar2 + 2) = uStack_80;
          puVar2 = (uint *)((long)&pnVar18[iVar15].m_backend.data + 4);
          *(undefined8 **)puVar2 = local_98;
          *(long *)(puVar2 + 2) = lStack_90;
          pnVar18[iVar15].m_backend.exp = fVar4;
          pnVar18[iVar15].m_backend.neg = (bool)((uVar3 != 0 || (int)uVar7 != 0) ^ (byte)iVar14);
          pnVar18[iVar15].m_backend.fpclass = (int)uVar7;
          pnVar18[iVar15].m_backend.prec_elem = (int)((ulong)uVar7 >> 0x20);
          this = local_58;
        }
        lVar20 = lVar20 + -1;
        lVar17 = lVar17 + -10;
      } while (1 < lVar20);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(p_vector,&this->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
  }
  SVar16 = status(this);
  return SVar16;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getSlacks(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE11 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == COLUMN)
   {
      int i;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(i = this->nRows() - 1; i >= 0; --i)
      {
         switch(ds.rowStatus(i))
         {
         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            p_vector[i] = this->lhs(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::P_FIXED :
            p_vector[i] = this->rhs(i);
            break;

         case SPxBasisBase<R>::Desc::P_FREE :
            p_vector[i] = 0;
            break;

         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_BOTH :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
            break;

         default:
            throw SPxInternalCodeException("XSOLVE12 This should never happen.");
         }
      }

      for(i = dim() - 1; i >= 0; --i)
      {
         if(this->baseId(i).isSPxRowId())
            p_vector[ this->number(SPxRowId(this->baseId(i))) ] = -(*theFvec)[i];
      }
   }
   else
      p_vector = pVec();

   return status();
}